

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O2

void __thiscall
kway_min_id_heap<int,_4,_std::less<int>_>::push
          (kway_min_id_heap<int,_4,_std::less<int>_> *this,int id,key_type key)

{
  int pos;
  pointer piVar1;
  reference rVar2;
  
  rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->contained_flags,(long)id);
  *rVar2._M_p = *rVar2._M_p | rVar2._M_mask;
  pos = this->heap_end;
  this->heap_end = pos + 1;
  piVar1 = (this->heap).
           super__Vector_base<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair,_std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar1[pos].id = id;
  piVar1[pos].key = key;
  (this->id_pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[id] = pos;
  move_up(this,pos);
  return;
}

Assistant:

void push(int id, key_type key)
    {
        assert(0 <= id && id < (int)id_pos.size() && "id is in range");
        assert(!contains(id) && "can not push an already existing id");

        contained_flags[id] = true;

        int new_pos = heap_end;
        ++heap_end;
        heap[new_pos].id = id;
        heap[new_pos].key = std::move(key);
        id_pos[id] = new_pos;
        move_up(new_pos);

        check_id_invariants();
        check_order_invariants();
    }